

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApa.c
# Opt level: O1

int Cudd_ApaPrintDecimal(FILE *fp,int digits,DdApaNumber number)

{
  undefined1 auVar1 [16];
  uint uVar2;
  int iVar3;
  void *__dest;
  void *__ptr;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  bool bVar10;
  
  __dest = malloc((long)digits << 2);
  if (__dest == (void *)0x0) {
    iVar8 = 0;
  }
  else {
    uVar2 = (uint)((double)digits * 9.632959861247398);
    __ptr = malloc((long)(int)(uVar2 + 1));
    if (__ptr == (void *)0x0) {
      iVar8 = 0;
      __ptr = __dest;
    }
    else {
      if (0 < digits) {
        memcpy(__dest,number,(ulong)(uint)digits * 4);
      }
      uVar7 = (ulong)uVar2;
      if (-1 < (int)uVar2) {
        do {
          if (digits < 1) {
            lVar5 = 0;
          }
          else {
            uVar9 = 0;
            lVar5 = 0;
            do {
              uVar4 = lVar5 << 0x20 | (ulong)*(uint *)((long)__dest + uVar9 * 4);
              auVar1._8_8_ = 0;
              auVar1._0_8_ = uVar4;
              uVar6 = SUB168(auVar1 * ZEXT816(0x6666666666666667),8) >> 2;
              *(int *)((long)__dest + uVar9 * 4) = (int)uVar6;
              lVar5 = uVar4 + uVar6 * -10;
              uVar9 = uVar9 + 1;
            } while ((uint)digits != uVar9);
          }
          *(char *)((long)__ptr + uVar7) = (char)lVar5;
          bVar10 = 0 < (long)uVar7;
          uVar7 = uVar7 - 1;
        } while (bVar10);
      }
      free(__dest);
      if (-1 < (int)uVar2) {
        bVar10 = true;
        uVar7 = 0;
        iVar8 = 0;
        do {
          if (bVar10) {
            bVar10 = *(char *)((long)__ptr + uVar7) == '\0';
          }
          else {
            bVar10 = false;
          }
          if ((!(bool)(bVar10 & uVar2 != uVar7)) &&
             (iVar3 = fprintf((FILE *)fp,"%1d",(ulong)*(byte *)((long)__ptr + uVar7)), iVar3 == -1))
          goto LAB_007bd2ba;
          uVar7 = uVar7 + 1;
        } while (uVar2 + 1 != uVar7);
      }
      iVar8 = 1;
    }
LAB_007bd2ba:
    free(__ptr);
  }
  return iVar8;
}

Assistant:

int
Cudd_ApaPrintDecimal(
  FILE * fp,
  int  digits,
  DdApaNumber  number)
{
    int i, result;
    DdApaDigit remainder;
    DdApaNumber work;
    unsigned char *decimal;
    int leadingzero;
    int decimalDigits = (int) (digits * log10((double) DD_APA_BASE)) + 1;

    work = Cudd_NewApaNumber(digits);
    if (work == NULL)
        return(0);
    decimal = ABC_ALLOC(unsigned char, decimalDigits);
    if (decimal == NULL) {
        ABC_FREE(work);
        return(0);
    }
    Cudd_ApaCopy(digits,number,work);
    for (i = decimalDigits - 1; i >= 0; i--) {
        remainder = Cudd_ApaShortDivision(digits,work,(DdApaDigit) 10,work);
        decimal[i] = (unsigned char) remainder;
    }
    ABC_FREE(work);

    leadingzero = 1;
    for (i = 0; i < decimalDigits; i++) {
        leadingzero = leadingzero && (decimal[i] == 0);
        if ((!leadingzero) || (i == (decimalDigits - 1))) {
            result = fprintf(fp,"%1d",decimal[i]);
            if (result == EOF) {
                ABC_FREE(decimal);
                return(0);
            }
        }
    }
    ABC_FREE(decimal);
    return(1);

}